

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall capnp::JsonCodec::decode(JsonCodec *this,Reader input,Builder output)

{
  word *pwVar1;
  Builder output_00;
  BuilderArena *pBVar2;
  CapTableBuilder *pCVar3;
  Orphanage orphanage;
  StructSchema type;
  StructBuilder inner;
  StructBuilder local_58;
  
  output_00 = output;
  kj::
  Table<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>>
  ::find<0ul,capnp::StructSchema&>
            ((Table<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>>
              *)&local_58,(StructSchema *)&((this->impl).ptr)->typeHandlers);
  if (local_58.segment == (SegmentBuilder *)0x0) {
    local_58.dataSize = output.builder.dataSize;
    local_58.pointerCount = output.builder.pointerCount;
    local_58._38_2_ = output.builder._38_2_;
    local_58.data = output.builder.data;
    local_58.pointers = output.builder.pointers;
    local_58.segment = output.builder.segment;
    local_58.capTable = output.builder.capTable;
    pBVar2 = capnp::_::StructBuilder::getArena(&local_58);
    pCVar3 = capnp::_::StructBuilder::getCapTable(&local_58);
    orphanage.capTable = pCVar3;
    orphanage.arena = pBVar2;
    decodeObject(this,input,output.schema,orphanage,output_00);
  }
  else {
    pwVar1 = ((local_58.segment)->super_SegmentReader).ptr.ptr;
    (**(code **)(pwVar1->content + 0x10))(pwVar1,this);
  }
  return;
}

Assistant:

void JsonCodec::decode(JsonValue::Reader input, DynamicStruct::Builder output) const {
  auto type = output.getSchema();

  KJ_IF_SOME(handler, impl->typeHandlers.find(type)) {
    return handler->decodeStructBase(*this, input, output);
  }

  decodeObject(input, type, Orphanage::getForMessageContaining(output), output);
}